

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

bool __thiscall
slang::ast::Expression::requireLValue
          (Expression *this,ASTContext *context,SourceLocation location,
          bitmask<slang::ast::AssignFlags> flags,Expression *longestStaticPrefix)

{
  SourceRange range;
  SourceLocation location_00;
  SourceLocation location_01;
  SourceLocation location_02;
  bool bVar1;
  SourceLocation location_03;
  MemberAccessExpression *pMVar2;
  ConcatenationExpression *this_00;
  reference ppEVar3;
  SimpleAssignmentPatternExpression *pSVar4;
  ConversionExpression *this_01;
  undefined1 in_CL;
  MemberAccessExpression *in_RDX;
  Diagnostic *in_RSI;
  SourceLocation in_RDI;
  ASTContext *in_R8;
  Expression *in_stack_00000018;
  ASTContext *in_stack_00000020;
  ValueExpressionBase *in_stack_00000028;
  bitmask<slang::ast::AssignFlags> in_stack_00000037;
  SourceLocation in_stack_00000038;
  Diagnostic *diag;
  ConversionExpression *conv;
  StreamExpression *op_1;
  iterator __end3_1;
  iterator __begin3_1;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  *__range3_1;
  StreamingConcatenationExpression *stream;
  Expression *op;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  ConcatenationExpression *concat;
  MemberAccessExpression *access;
  RangeSelectExpression *select_1;
  ElementSelectExpression *select;
  ValueExpressionBase *ve;
  Expression *in_stack_fffffffffffffe68;
  Diagnostic *in_stack_fffffffffffffe70;
  SourceLocation in_stack_fffffffffffffe78;
  Expression *this_02;
  SourceLocation in_stack_fffffffffffffe80;
  DiagCode code;
  bitmask<slang::ast::AssignFlags> local_11a;
  underlying_type local_119;
  reference local_110;
  StreamExpression *local_108;
  __normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
  local_100;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  local_f8;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  *local_e8;
  StreamingConcatenationExpression *local_e0;
  bitmask<slang::ast::AssignFlags> local_d2;
  underlying_type local_d1;
  Expression *local_c8;
  Expression **local_c0;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_b8;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_b0;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *local_a0;
  Expression *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  Expression *in_stack_ffffffffffffffc8;
  SourceLocation SVar5;
  bitmask<slang::ast::AssignFlags> flags_00;
  undefined7 in_stack_ffffffffffffffe8;
  bool local_1;
  
  location_03._4_4_ = 0;
  location_03._0_4_ = *(uint *)in_RDI;
  switch(location_03) {
  case (SourceLocation)0x0:
    local_1 = false;
    break;
  default:
    goto LAB_01256ac3;
  case (SourceLocation)0x8:
  case (SourceLocation)0x9:
    as<slang::ast::ValueExpressionBase>((Expression *)in_RDI);
    local_1 = ValueExpressionBase::requireLValueImpl
                        (in_stack_00000028,in_stack_00000020,in_stack_00000038,in_stack_00000037,
                         in_stack_00000018);
    break;
  case (SourceLocation)0xf:
    SVar5 = in_RDI;
    this_00 = as<slang::ast::ConcatenationExpression>((Expression *)in_RDI);
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x1256782);
    bVar1 = Type::isIntegral((Type *)in_stack_fffffffffffffe70);
    if (bVar1) {
      local_b0 = ConcatenationExpression::operands(this_00);
      local_a0 = &local_b0;
      local_b8._M_current =
           (Expression **)
           std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                     ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                      in_stack_fffffffffffffe68);
      local_c0 = (Expression **)
                 std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                           ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                            in_stack_fffffffffffffe78);
      while( true ) {
        bVar1 = __gnu_cxx::
                operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                          ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                            *)in_stack_fffffffffffffe70,
                           (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                            *)in_stack_fffffffffffffe68);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          return true;
        }
        ppEVar3 = __gnu_cxx::
                  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                  ::operator*(&local_b8);
        this_02 = *ppEVar3;
        local_c8 = this_02;
        bitmask<slang::ast::AssignFlags>::bitmask(&local_d2,InConcat);
        local_d1 = (underlying_type)
                   bitmask<slang::ast::AssignFlags>::operator|
                             ((bitmask<slang::ast::AssignFlags> *)this_02,
                              (bitmask<slang::ast::AssignFlags> *)in_stack_fffffffffffffe70);
        location_01._7_1_ = in_CL;
        location_01._0_7_ = in_stack_ffffffffffffffe8;
        bVar1 = requireLValue((Expression *)in_RSI,in_R8,location_01,
                              (bitmask<slang::ast::AssignFlags>)SVar5._7_1_,
                              in_stack_ffffffffffffffc8);
        if (((bVar1 ^ 0xffU) & 1) != 0) break;
        __gnu_cxx::
        __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
        ::operator++(&local_b8);
      }
      return false;
    }
    goto LAB_01256ac3;
  case (SourceLocation)0x11:
    local_e0 = as<slang::ast::StreamingConcatenationExpression>((Expression *)in_RDI);
    local_f8 = StreamingConcatenationExpression::streams(local_e0);
    local_e8 = &local_f8;
    local_100._M_current =
         (StreamExpression *)
         std::
         span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
         ::begin((span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                  *)in_stack_fffffffffffffe68);
    local_108 = (StreamExpression *)
                std::
                span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                ::end((span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                       *)in_stack_fffffffffffffe78);
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffe70,
                              (__normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffe68), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_110 = __gnu_cxx::
                  __normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
                  ::operator*(&local_100);
      in_stack_fffffffffffffe70 = in_RSI;
      in_stack_fffffffffffffe68 =
           not_null<const_slang::ast::Expression_*>::operator->
                     ((not_null<const_slang::ast::Expression_*> *)0x12569a2);
      in_RSI = in_stack_fffffffffffffe70;
      bitmask<slang::ast::AssignFlags>::bitmask(&local_11a,InConcat);
      local_119 = (underlying_type)
                  bitmask<slang::ast::AssignFlags>::operator|
                            ((bitmask<slang::ast::AssignFlags> *)in_stack_fffffffffffffe78,
                             (bitmask<slang::ast::AssignFlags> *)in_stack_fffffffffffffe70);
      location_02._7_1_ = in_CL;
      location_02._0_7_ = in_stack_ffffffffffffffe8;
      bVar1 = requireLValue((Expression *)in_RSI,in_R8,location_02,
                            (bitmask<slang::ast::AssignFlags>)in_RDI._7_1_,in_stack_ffffffffffffffc8
                           );
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
      ::operator++(&local_100);
    }
    local_1 = true;
    break;
  case (SourceLocation)0x12:
    as<slang::ast::ElementSelectExpression>((Expression *)in_RDI);
    local_1 = ElementSelectExpression::requireLValueImpl
                        ((ElementSelectExpression *)in_stack_fffffffffffffe80,
                         (ASTContext *)in_stack_fffffffffffffe78,location_03,
                         (bitmask<slang::ast::AssignFlags>)in_RDI._7_1_,
                         (Expression *)in_stack_fffffffffffffe70);
    break;
  case (SourceLocation)0x13:
    as<slang::ast::RangeSelectExpression>((Expression *)in_RDI);
    local_1 = RangeSelectExpression::requireLValueImpl
                        ((RangeSelectExpression *)in_stack_fffffffffffffe80,
                         (ASTContext *)in_stack_fffffffffffffe78,location_03,
                         (bitmask<slang::ast::AssignFlags>)in_RDI._7_1_,
                         (Expression *)in_stack_fffffffffffffe70);
    break;
  case (SourceLocation)0x14:
    pMVar2 = as<slang::ast::MemberAccessExpression>((Expression *)in_RDI);
    location_00._7_1_ = in_stack_ffffffffffffff8f;
    location_00._0_7_ = in_stack_ffffffffffffff88;
    local_1 = MemberAccessExpression::requireLValueImpl
                        (in_RDX,(ASTContext *)CONCAT17(in_CL,in_stack_ffffffffffffff70),location_00,
                         (bitmask<slang::ast::AssignFlags>)(underlying_type)((ulong)pMVar2 >> 0x38),
                         in_stack_ffffffffffffff68);
    break;
  case (SourceLocation)0x16:
    SVar5 = in_RDI;
    this_01 = as<slang::ast::ConversionExpression>((Expression *)in_RDI);
    flags_00.m_bits = SVar5._7_1_;
    bVar1 = ConversionExpression::isImplicit(this_01);
    if (bVar1) {
      ConversionExpression::operand(this_01);
      SVar5._7_1_ = in_CL;
      SVar5._0_7_ = in_stack_ffffffffffffffe8;
      bVar1 = requireLValue((Expression *)in_RSI,in_R8,SVar5,flags_00,in_stack_ffffffffffffffc8);
      return bVar1;
    }
LAB_01256ac3:
    code = location_03._4_4_;
    bVar1 = SourceLocation::operator_cast_to_bool((SourceLocation *)0x1256ad0);
    if (!bVar1) {
      SourceRange::start((SourceRange *)((long)in_RDI + 0x20));
    }
    ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffe80,code,in_RDI);
    range.endLoc = in_stack_fffffffffffffe80;
    range.startLoc = in_stack_fffffffffffffe78;
    Diagnostic::operator<<(in_stack_fffffffffffffe70,range);
    local_1 = false;
    break;
  case (SourceLocation)0x1b:
    pSVar4 = as<slang::ast::SimpleAssignmentPatternExpression>((Expression *)in_RDI);
    local_1 = (bool)(pSVar4->isLValue & 1);
  }
  return local_1;
}

Assistant:

bool Expression::requireLValue(const ASTContext& context, SourceLocation location,
                               bitmask<AssignFlags> flags,
                               const Expression* longestStaticPrefix) const {
    switch (kind) {
        case ExpressionKind::NamedValue:
        case ExpressionKind::HierarchicalValue: {
            auto& ve = as<ValueExpressionBase>();
            return ve.requireLValueImpl(context, location, flags, longestStaticPrefix);
        }
        case ExpressionKind::ElementSelect: {
            auto& select = as<ElementSelectExpression>();
            return select.requireLValueImpl(context, location, flags, longestStaticPrefix);
        }
        case ExpressionKind::RangeSelect: {
            auto& select = as<RangeSelectExpression>();
            return select.requireLValueImpl(context, location, flags, longestStaticPrefix);
        }
        case ExpressionKind::MemberAccess: {
            auto& access = as<MemberAccessExpression>();
            return access.requireLValueImpl(context, location, flags, longestStaticPrefix);
        }
        case ExpressionKind::Concatenation: {
            auto& concat = as<ConcatenationExpression>();
            if (!concat.type->isIntegral())
                break;

            SLANG_ASSERT(!longestStaticPrefix || flags.has(AssignFlags::SlicedPort));
            for (auto op : concat.operands()) {
                if (!op->requireLValue(context, location, flags | AssignFlags::InConcat)) {
                    return false;
                }
            }
            return true;
        }
        case ExpressionKind::SimpleAssignmentPattern:
            return as<SimpleAssignmentPatternExpression>().isLValue;
        case ExpressionKind::Streaming: {
            SLANG_ASSERT(!longestStaticPrefix);
            auto& stream = as<StreamingConcatenationExpression>();
            for (auto& op : stream.streams()) {
                if (!op.operand->requireLValue(context, location, flags | AssignFlags::InConcat,
                                               longestStaticPrefix)) {
                    return false;
                }
            }
            return true;
        }
        case ExpressionKind::Conversion: {
            auto& conv = as<ConversionExpression>();
            if (conv.isImplicit()) {
                return conv.operand().requireLValue(context, location, flags, longestStaticPrefix);
            }
            break;
        }
        case ExpressionKind::Invalid:
            return false;
        default:
            break;
    }

    if (!location)
        location = sourceRange.start();

    auto& diag = context.addDiag(diag::ExpressionNotAssignable, location);
    diag << sourceRange;
    return false;
}